

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O0

int cod_streq(char *str1,char *str2)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  int ret;
  undefined4 local_4;
  
  if ((in_RDI == (char *)0x0) && (in_RSI == (char *)0x0)) {
    local_4 = 0;
  }
  else if ((in_RDI == (char *)0x0) || (in_RSI == (char *)0x0)) {
    local_4 = 1;
  }
  else {
    iVar1 = strcmp(in_RDI,in_RSI);
    local_4 = (uint)(iVar1 != 0);
  }
  return local_4;
}

Assistant:

static int
cod_streq(char *str1, char *str2)
{
    int ret;
    if ((str1 == NULL) && (str2 == NULL)) return 0;
    if ((str1 == NULL) || (str2 == NULL)) return 1;
    ret = (strcmp(str1, str2) != 0);
/*    printf("Comparing %s and %s, returning %d\n", str1, str2, ret);*/
    return ret;
}